

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O1

int Rpo_CheckORGroup(Literal_t *lit1,Literal_t *lit2,int nVars)

{
  uint *puVar1;
  uint *puVar2;
  void *__ptr;
  void *__ptr_00;
  ulong uVar3;
  int iVar4;
  uint uVar6;
  long lVar7;
  ulong uVar5;
  
  uVar6 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar6 = 1;
  }
  __ptr = malloc((long)(int)uVar6 * 4);
  __ptr_00 = malloc((long)(int)uVar6 * 4);
  uVar3 = (ulong)uVar6;
  uVar5 = uVar3;
  if (0 < (int)uVar6) {
    puVar1 = lit1->transition;
    puVar2 = lit2->function;
    lVar7 = uVar3 + 1;
    do {
      *(uint *)((long)__ptr + lVar7 * 4 + -8) = puVar2[lVar7 + -2] & puVar1[lVar7 + -2];
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  do {
    iVar4 = (int)uVar5;
    if (iVar4 < 1) goto LAB_005e5bd9;
    lVar7 = uVar5 * 4;
    uVar5 = uVar5 - 1;
  } while (*(int *)((long)__ptr + lVar7 + -4) == 0);
  if (iVar4 < 1) {
LAB_005e5bd9:
    if (0 < (int)uVar6) {
      puVar1 = lit2->transition;
      puVar2 = lit1->function;
      lVar7 = uVar3 + 1;
      do {
        *(uint *)((long)__ptr_00 + lVar7 * 4 + -8) = puVar2[lVar7 + -2] & puVar1[lVar7 + -2];
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    do {
      if ((int)uVar3 < 1) {
        iVar4 = 1;
        goto LAB_005e5c14;
      }
      lVar7 = uVar3 * 4;
      uVar3 = uVar3 - 1;
    } while (*(int *)((long)__ptr_00 + lVar7 + -4) == 0);
  }
  iVar4 = 0;
LAB_005e5c14:
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return iVar4;
}

Assistant:

int Rpo_CheckORGroup(Literal_t* lit1, Literal_t* lit2, int nVars) {
    unsigned* and1 = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    unsigned* and2 = ABC_ALLOC(unsigned, Kit_TruthWordNum(nVars));
    int isZero;
    Kit_TruthAnd(and1, lit1->transition, lit2->function, nVars);
    isZero = Kit_TruthIsConst0(and1, nVars);
    if (isZero) {
        Kit_TruthAnd(and2, lit2->transition, lit1->function, nVars);
        isZero = Kit_TruthIsConst0(and2, nVars);
    }
    ABC_FREE(and1);
    ABC_FREE(and2);
    return isZero;
}